

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O3

int EmitAlphaRGB(VP8Io *io,WebPDecParams *p,int expected_num_lines_out)

{
  int iVar1;
  WEBP_CSP_MODE WVar2;
  WebPDecBuffer *pWVar3;
  int iVar4;
  int iVar5;
  uint8_t *puVar6;
  int num_rows;
  uint8_t *alpha;
  int local_3c;
  uint8_t *local_38;
  
  local_38 = io->a;
  if (local_38 != (uint8_t *)0x0) {
    iVar1 = io->mb_w;
    pWVar3 = p->output;
    WVar2 = pWVar3->colorspace;
    iVar4 = GetAlphaSourceRow(io,&local_38,&local_3c);
    iVar5 = (pWVar3->u).RGBA.stride;
    puVar6 = (pWVar3->u).RGBA.rgba + (long)iVar4 * (long)iVar5;
    iVar5 = (*WebPDispatchAlpha)
                      (local_38,io->width,iVar1,local_3c,
                       puVar6 + (ulong)(WVar2 != MODE_Argb && WVar2 != MODE_ARGB) * 3,iVar5);
    if ((0xfffffffb < WVar2 - MODE_YUV) && (iVar5 != 0)) {
      (*WebPApplyAlphaMultiply)
                (puVar6,(uint)(WVar2 == MODE_Argb || WVar2 == MODE_ARGB),iVar1,local_3c,
                 (pWVar3->u).RGBA.stride);
    }
  }
  return 0;
}

Assistant:

static int EmitAlphaRGB(const VP8Io* const io, WebPDecParams* const p,
                        int expected_num_lines_out) {
  const uint8_t* alpha = io->a;
  if (alpha != NULL) {
    const int mb_w = io->mb_w;
    const WEBP_CSP_MODE colorspace = p->output->colorspace;
    const int alpha_first =
        (colorspace == MODE_ARGB || colorspace == MODE_Argb);
    const WebPRGBABuffer* const buf = &p->output->u.RGBA;
    int num_rows;
    const int start_y = GetAlphaSourceRow(io, &alpha, &num_rows);
    uint8_t* const base_rgba = buf->rgba + (ptrdiff_t)start_y * buf->stride;
    uint8_t* const dst = base_rgba + (alpha_first ? 0 : 3);
    const int has_alpha = WebPDispatchAlpha(alpha, io->width, mb_w,
                                            num_rows, dst, buf->stride);
    (void)expected_num_lines_out;
    assert(expected_num_lines_out == num_rows);
    // has_alpha is true if there's non-trivial alpha to premultiply with.
    if (has_alpha && WebPIsPremultipliedMode(colorspace)) {
      WebPApplyAlphaMultiply(base_rgba, alpha_first,
                             mb_w, num_rows, buf->stride);
    }
  }
  return 0;
}